

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O3

void amrex::EB_WriteMultiLevelPlotfile
               (string *plotfilename,int nlevels,
               Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *mf,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *extra_dirs)

{
  tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  tVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pBVar4;
  long lVar5;
  long *plVar6;
  void *__s;
  MultiFab *pMVar7;
  size_type *psVar8;
  long lVar9;
  int iVar10;
  value_type *__val;
  pointer pbVar11;
  long lVar12;
  ulong uVar13;
  pointer_____offset_0x10___ *ppuVar14;
  char *pcVar15;
  string *psVar16;
  BoxArray *pBVar17;
  undefined8 *puVar18;
  byte bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> boxArrays;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_268;
  Real local_260;
  Vector<int,_std::allocator<int>_> *local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_250;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vn;
  string ed;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  bVar19 = 0;
  tVar1.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         *)&((*(mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
               .
               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_FabArray<amrex::FArrayBox>).
            m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ;
  local_268 = geom;
  local_260 = time;
  local_258 = level_steps;
  local_250 = &varnames->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  if (tVar1.
      super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
      .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>)0x0) {
    ppuVar14 = &FabFactory<amrex::FArrayBox>::typeinfo;
    lVar5 = __dynamic_cast(tVar1.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo);
    if (lVar5 != 0) goto LAB_0057eead;
  }
  pcVar15 = 
  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp"
  ;
  Assert_host("mf[0]->hasEBFabFactory()",
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Base/AMReX_PlotFileUtil.cpp"
              ,0x18b,"\"EB_WriteMultiLevelPlotfile: does not have EB Factory\"");
  ppuVar14 = (pointer_____offset_0x10___ *)pcVar15;
LAB_0057eead:
  PreBuildDirectorHierarchy(plotfilename,(string *)ppuVar14,nlevels,false);
  pbVar11 = (extra_dirs->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (extra_dirs->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != pbVar2) {
    do {
      pcVar3 = (plotfilename->_M_dataplus)._M_p;
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str,pcVar3,pcVar3 + plotfilename->_M_string_length);
      std::__cxx11::string::append((char *)&__str);
      psVar16 = (string *)(pbVar11->_M_dataplus)._M_p;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&__str,(ulong)psVar16);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        ed.field_2._M_allocated_capacity = *psVar8;
        ed.field_2._8_8_ = plVar6[3];
        ed._M_dataplus._M_p = (pointer)&ed.field_2;
      }
      else {
        ed.field_2._M_allocated_capacity = *psVar8;
        ed._M_dataplus._M_p = (pointer)*plVar6;
      }
      ed._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        psVar16 = (string *)(__str.field_2._M_allocated_capacity + 1);
        operator_delete(__str._M_dataplus._M_p,(ulong)psVar16);
      }
      PreBuildDirectorHierarchy(&ed,psVar16,nlevels,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ed._M_dataplus._M_p != &ed.field_2) {
        operator_delete(ed._M_dataplus._M_p,ed.field_2._M_allocated_capacity + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar2);
  }
  ParallelDescriptor::Barrier((string *)ParallelDescriptor::Unnamed_abi_cxx11_);
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    __s = operator_new(0x200000);
    memset(__s,0,0x200000);
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    pcVar3 = (plotfilename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,pcVar3,pcVar3 + plotfilename->_M_string_length);
    std::__cxx11::string::append((char *)&__str);
    std::ofstream::ofstream(&ed);
    (**(code **)(ed._M_string_length + 0x18))(&ed._M_string_length,__s,0x200000);
    std::ofstream::open((char *)&ed,(_Ios_Openmode)__str._M_dataplus._M_p);
    if (*(int *)((long)aiStack_210 + *(long *)(ed._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(&__str);
    }
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)nlevels,(allocator_type *)&local_288);
    if (boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
        super__Vector_impl_data._M_start &&
        -1 < (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start) {
      lVar5 = 0x50;
      lVar12 = 0;
      do {
        pBVar4 = boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar7 = (mf->
                 super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                 super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar12];
        pBVar17 = (BoxArray *)
                  ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8);
        puVar18 = (undefined8 *)
                  ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar5 + -0x50);
        for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = *(undefined8 *)&pBVar17->m_bat;
          pBVar17 = (BoxArray *)((long)pBVar17 + ((ulong)bVar19 * -2 + 1) * 8);
          puVar18 = puVar18 + (ulong)bVar19 * -2 + 1;
        }
        *(element_type **)
         ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                super__Vector_impl_data._M_start + lVar5 + -8) =
             (((shared_ptr<amrex::BARef> *)
              ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x50))->
             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((boxArrays.
                             super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type + lVar5),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x58));
        *(element_type **)((long)&(pBVar4->m_bat).m_op + lVar5 + 4) =
             (((shared_ptr<amrex::BoxList> *)
              ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x60))->
             super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pBVar4->m_bat).m_op + lVar5 + 0xc),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0x68));
        lVar12 = lVar12 + 1;
        lVar9 = ((long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        lVar5 = lVar5 + 0x68;
      } while (lVar9 - lVar12 != 0 && lVar12 <= lVar9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&vn.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,local_250);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"vfrac","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vn,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    WriteGenericPlotfileHeader
              ((ostream *)&ed,nlevels,&boxArrays,&vn,local_268,local_260,local_258,ref_ratio,
               versionName,levelPrefix,mfPrefix);
    if (0 < nlevels) {
      iVar10 = nlevels;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ed,"1.0e-6\n",7);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vn.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              (&boxArrays.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
    ed._M_dataplus._M_p = _VTT;
    *(undefined8 *)((long)aiStack_210 + *(long *)(_VTT + -0x18) + -0x20) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)&ed._M_string_length);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    operator_delete(__s,0x200000);
  }
  if (0 < nlevels) {
    uVar13 = 0;
    do {
      pMVar7 = (mf->super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>)
               .
               super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13];
      iVar10 = *(int *)((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 0xcc)
      ;
      __str._M_dataplus._M_p = (pointer)0x1;
      __str.field_2._8_8_ = 0;
      __str._M_string_length = 0;
      __str.field_2._M_allocated_capacity = 0;
      local_288._M_dataplus._M_p = (pointer)&PTR__FabFactory_0080b918;
      MultiFab::MultiFab((MultiFab *)&ed,
                         (BoxArray *)
                         ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),
                         (DistributionMapping *)
                         ((long)&(pMVar7->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                         0x70),iVar10 + 1,0,(MFInfo *)&__str,
                         (FabFactory<amrex::FArrayBox> *)&local_288);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__str.field_2);
      MultiFab::Copy((MultiFab *)&ed,
                     (mf->
                     super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     ).
                     super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13],0,0,iVar10,0);
      lVar5 = __dynamic_cast((tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                              )((mf->
                                super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ).
                                super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13]->
                               super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo,
                             0);
      if (lVar5 == 0) {
        __cxa_bad_cast();
      }
      pMVar7 = EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar5 + 0xd8));
      MultiFab::Copy((MultiFab *)&ed,pMVar7,0,iVar10,1,0);
      MultiFabFileFullPrefix((string *)&__str,(int)uVar13,plotfilename,levelPrefix,mfPrefix);
      VisMF::Write((FabArray<amrex::FArrayBox> *)&ed,(string *)&__str,NFiles,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      MultiFab::~MultiFab((MultiFab *)&ed);
      uVar13 = uVar13 + 1;
    } while ((uint)nlevels != uVar13);
  }
  return;
}

Assistant:

void
EB_WriteMultiLevelPlotfile (const std::string& plotfilename, int nlevels,
                            const Vector<const MultiFab*>& mf,
                            const Vector<std::string>& varnames,
                            const Vector<Geometry>& geom, Real time, const Vector<int>& level_steps,
                            const Vector<IntVect>& ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix,
                            const Vector<std::string>& extra_dirs)
{
    BL_PROFILE("WriteMultiLevelPlotfile()");

    BL_ASSERT(nlevels <= mf.size());
    BL_ASSERT(nlevels <= geom.size());
    BL_ASSERT(nlevels <= ref_ratio.size()+1);
    BL_ASSERT(nlevels <= level_steps.size());
    BL_ASSERT(mf[0]->nComp() == varnames.size());
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(mf[0]->hasEBFabFactory(),
                                     "EB_WriteMultiLevelPlotfile: does not have EB Factory");

    int finest_level = nlevels-1;

//    int saveNFiles(VisMF::GetNOutFiles());
//    VisMF::SetNOutFiles(std::max(1024,saveNFiles));

    bool callBarrier(false);
    PreBuildDirectorHierarchy(plotfilename, levelPrefix, nlevels, callBarrier);
    if (!extra_dirs.empty()) {
        for (const auto& d : extra_dirs) {
            const std::string ed = plotfilename+"/"+d;
            amrex::PreBuildDirectorHierarchy(ed, levelPrefix, nlevels, callBarrier);
        }
    }
    ParallelDescriptor::Barrier();

    if (ParallelDescriptor::IOProcessor()) {
        VisMF::IO_Buffer io_buffer(VisMF::IO_Buffer_Size);
        std::string HeaderFileName(plotfilename + "/Header");
        std::ofstream HeaderFile;
        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());
        HeaderFile.open(HeaderFileName.c_str(), std::ofstream::out   |
                                                std::ofstream::trunc |
                                                std::ofstream::binary);
        if( ! HeaderFile.good()) {
            FileOpenFailed(HeaderFileName);
        }

        Vector<BoxArray> boxArrays(nlevels);
        for(int level(0); level < boxArrays.size(); ++level) {
            boxArrays[level] = mf[level]->boxArray();
        }

        Vector<std::string> vn = varnames;
        vn.push_back("vfrac");
        WriteGenericPlotfileHeader(HeaderFile, nlevels, boxArrays, vn,
                                   geom, time, level_steps, ref_ratio, versionName,
                                   levelPrefix, mfPrefix);

        for (int lev = 0; lev < nlevels; ++lev) {
            HeaderFile << "1.0e-6\n";
        }
    }


    for (int level = 0; level <= finest_level; ++level)
    {
        const int nc = mf[level]->nComp();
        MultiFab mf_tmp(mf[level]->boxArray(),
                        mf[level]->DistributionMap(),
                        nc+1, 0);
        MultiFab::Copy(mf_tmp, *mf[level], 0, 0, nc, 0);
        auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(mf[level]->Factory());
        MultiFab::Copy(mf_tmp, factory.getVolFrac(), 0, nc, 1, 0);
        VisMF::Write(mf_tmp, MultiFabFileFullPrefix(level, plotfilename, levelPrefix, mfPrefix));
    }

//    VisMF::SetNOutFiles(saveNFiles);
}